

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonmax.c
# Opt level: O3

xy * aom_nonmax_suppression
               (xy *corners,int *scores,int num_corners,int **ret_scores,int *ret_num_nonmax)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  xy *__ptr;
  xy *pxVar8;
  void *__s;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  
  *ret_scores = (int *)0x0;
  *ret_num_nonmax = -1;
  if ((scores == (int *)0x0 || corners == (xy *)0x0) || num_corners < 1) {
    *ret_num_nonmax = 0;
  }
  else {
    uVar16 = (ulong)(uint)num_corners;
    __ptr = (xy *)malloc(uVar16 * 8);
    if (__ptr != (xy *)0x0) {
      pxVar8 = (xy *)malloc(uVar16 * 4);
      if (pxVar8 != (xy *)0x0) {
        iVar2 = corners[num_corners - 1U].y;
        __s = malloc((long)(int)(iVar2 + 1U) << 2);
        if (__s != (void *)0x0) {
          if (-1 < iVar2) {
            memset(__s,0xff,(ulong)(iVar2 + 1U) << 2);
          }
          iVar14 = -1;
          uVar9 = 0;
          do {
            iVar3 = corners[uVar9].y;
            if (iVar3 != iVar14) {
              *(int *)((long)__s + (long)iVar3 * 4) = (int)uVar9;
              iVar14 = iVar3;
            }
            uVar9 = uVar9 + 1;
          } while (uVar16 != uVar9);
          uVar10 = 0;
          iVar14 = 0;
          uVar9 = 0;
          uVar12 = 0;
          do {
            iVar3 = scores[uVar10];
            iVar4 = corners[uVar10].x;
            iVar5 = corners[uVar10].y;
            if (((((uVar10 == 0) || (corners[uVar10 - 1].x != iVar4 + -1)) ||
                 (corners[uVar10 - 1].y != iVar5)) || (scores[uVar10 - 1] < iVar3)) &&
               ((((long)(int)(num_corners - 1U) <= (long)uVar10 ||
                 (corners[uVar10 + 1].x != iVar4 + 1)) ||
                ((corners[uVar10 + 1].y != iVar5 || (scores[uVar10 + 1] < iVar3)))))) {
              if (0 < iVar5) {
                uVar6 = *(uint *)((long)__s + (ulong)(iVar5 - 1U) * 4);
                if (uVar6 != 0xffffffff) {
                  iVar11 = (int)uVar9;
                  uVar9 = uVar9 & 0xffffffff;
                  if (corners[iVar11].y < (int)(iVar5 - 1U)) {
                    uVar9 = (ulong)uVar6;
                  }
                  uVar13 = (ulong)(int)uVar9;
                  iVar11 = corners[uVar13].y;
                  if (iVar11 < iVar5) {
                    do {
                      uVar9 = uVar13;
                      if (iVar4 + -1 <= corners[uVar13].x) break;
                      uVar9 = uVar13 + 1;
                      lVar15 = uVar13 + 1;
                      uVar13 = uVar9;
                    } while (corners[lVar15].y < iVar5);
                    uVar13 = (ulong)(int)uVar9;
                    iVar11 = corners[uVar13].y;
                  }
                  if (iVar11 < iVar5) {
                    iVar11 = iVar4 + 1;
                    lVar15 = uVar13 << 2;
                    do {
                      iVar7 = *(int *)((long)&corners->x + lVar15 * 2);
                      if (iVar7 != iVar11 && iVar11 <= iVar7) break;
                      if ((((iVar7 == iVar11) || (iVar7 == iVar4 + -1)) || (iVar7 == iVar4)) &&
                         (iVar3 <= *(int *)((long)scores + lVar15))) goto LAB_003c9f0c;
                      lVar1 = lVar15 * 2;
                      lVar15 = lVar15 + 4;
                    } while (*(int *)((long)&corners[1].y + lVar1) < iVar5);
                  }
                }
              }
              if (((iVar5 < iVar2) &&
                  (uVar6 = *(uint *)((long)__s + (long)iVar5 * 4 + 4), uVar6 != 0xffffffff)) &&
                 ((int)uVar12 < num_corners)) {
                if (iVar5 < corners[(int)uVar12].y) {
                  uVar6 = uVar12;
                }
                uVar13 = (ulong)uVar6;
                if ((int)uVar6 < num_corners) {
                  uVar13 = (ulong)(int)uVar6;
                  do {
                    if ((corners[uVar13].y != iVar5 + 1) || (iVar4 + -1 <= corners[uVar13].x))
                    goto LAB_003c9e72;
                    uVar13 = uVar13 + 1;
                    uVar12 = num_corners;
                  } while (uVar16 != uVar13);
                }
                else {
LAB_003c9e72:
                  uVar12 = (uint)uVar13;
                  if ((int)uVar12 < num_corners) {
                    iVar11 = iVar4 + 1;
                    lVar15 = 0;
                    do {
                      if (corners[(int)uVar12 + lVar15].y != iVar5 + 1) break;
                      iVar7 = corners[(int)uVar12 + lVar15].x;
                      if (iVar7 != iVar11 && iVar11 <= iVar7) break;
                      if ((((iVar7 == iVar11) || (iVar7 == iVar4 + -1)) || (iVar7 == iVar4)) &&
                         (iVar3 <= scores[(int)uVar12 + lVar15])) goto LAB_003c9f0c;
                      lVar15 = lVar15 + 1;
                    } while (num_corners - uVar12 != (int)lVar15);
                  }
                }
              }
              __ptr[iVar14] = corners[uVar10];
              (&pxVar8->x)[iVar14] = iVar3;
              iVar14 = iVar14 + 1;
            }
LAB_003c9f0c:
            uVar10 = uVar10 + 1;
            if (uVar10 == uVar16) {
              free(__s);
              *ret_scores = (int *)pxVar8;
              *ret_num_nonmax = iVar14;
              return __ptr;
            }
          } while( true );
        }
        free(__ptr);
        __ptr = pxVar8;
      }
      free(__ptr);
    }
  }
  return (xy *)0x0;
}

Assistant:

xy* aom_nonmax_suppression(const xy* corners, const int* scores, int num_corners,
                           int** ret_scores, int* ret_num_nonmax)
{
  int num_nonmax=0;
  int last_row;
  int* row_start;
  int i, j;
  xy* ret_nonmax;
  int* nonmax_scores;
  const int sz = (int)num_corners;

  /*Point above points (roughly) to the pixel above the one of interest, if there
    is a feature there.*/
  int point_above = 0;
  int point_below = 0;

  *ret_scores = 0;
  *ret_num_nonmax = -1;
  if(!(corners && scores) || num_corners < 1)
  {
    *ret_num_nonmax = 0;
    return 0;
  }

  ret_nonmax = (xy*)malloc(num_corners * sizeof(xy));
  if(!ret_nonmax)
  {
    return 0;
  }

  nonmax_scores = (int*)malloc(num_corners * sizeof(*nonmax_scores));
  if (!nonmax_scores)
  {
    free(ret_nonmax);
    return 0;
  }

  /* Find where each row begins
     (the corners are output in raster scan order). A beginning of -1 signifies
     that there are no corners on that row. */
  last_row = corners[num_corners-1].y;
  row_start = (int*)malloc((last_row+1)*sizeof(int));
  if(!row_start)
  {
    free(ret_nonmax);
    free(nonmax_scores);
    return 0;
  }

  for(i=0; i < last_row+1; i++)
    row_start[i] = -1;

  {
    int prev_row = -1;
    for(i=0; i< num_corners; i++)
      if(corners[i].y != prev_row)
      {
        row_start[corners[i].y] = i;
        prev_row = corners[i].y;
      }
  }



  for(i=0; i < sz; i++)
  {
    int score = scores[i];
    xy pos = corners[i];
    assert(pos.y <= last_row);

    /*Check left */
    if(i > 0)
      if(corners[i-1].x == pos.x-1 && corners[i-1].y == pos.y && Compare(scores[i-1], score))
        continue;

    /*Check right*/
    if(i < (sz - 1))
      if(corners[i+1].x == pos.x+1 && corners[i+1].y == pos.y && Compare(scores[i+1], score))
        continue;

    /*Check above (if there is a valid row above)*/
    if(pos.y > 0 && row_start[pos.y - 1] != -1)
    {
      /*Make sure that current point_above is one
        row above.*/
      if(corners[point_above].y < pos.y - 1)
        point_above = row_start[pos.y-1];

      /*Make point_above point to the first of the pixels above the current point,
        if it exists.*/
      for(; corners[point_above].y < pos.y && corners[point_above].x < pos.x - 1; point_above++)
      {}


      for(j=point_above; corners[j].y < pos.y && corners[j].x <= pos.x + 1; j++)
      {
        int x = corners[j].x;
        if( (x == pos.x - 1 || x ==pos.x || x == pos.x+1) && Compare(scores[j], score))
          goto cont;
      }

    }

    /*Check below (if there is anything below)*/
    if (pos.y + 1 < last_row+1 && row_start[pos.y + 1] != -1 && point_below < sz) /*Nothing below*/
    {
      if(corners[point_below].y < pos.y + 1)
        point_below = row_start[pos.y+1];

      /* Make point below point to one of the pixels belowthe current point, if it
         exists.*/
      for(; point_below < sz && corners[point_below].y == pos.y+1 && corners[point_below].x < pos.x - 1; point_below++)
      {}

      for(j=point_below; j < sz && corners[j].y == pos.y+1 && corners[j].x <= pos.x + 1; j++)
      {
        int x = corners[j].x;
        if( (x == pos.x - 1 || x ==pos.x || x == pos.x+1) && Compare(scores[j],score))
          goto cont;
      }
    }

    ret_nonmax[num_nonmax] = corners[i];
    nonmax_scores[num_nonmax] = scores[i];
    num_nonmax++;
cont:
    ;
  }

  free(row_start);
  *ret_scores = nonmax_scores;
  *ret_num_nonmax = num_nonmax;
  return ret_nonmax;
}